

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::SaveBinsSummary
          (BamStandardIndex *this,int *refId,int *numBins)

{
  int iVar1;
  reference pvVar2;
  undefined4 extraout_var;
  
  pvVar2 = std::
           vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ::at(&this->m_indexFileSummary,(long)*refId);
  pvVar2->NumBins = *numBins;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  pvVar2->FirstBinFilePosition = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void BamStandardIndex::SaveBinsSummary(const int& refId, const int& numBins)
{
    BaiReferenceSummary& refSummary = m_indexFileSummary.at(refId);
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();
}